

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

RepeatProd * __thiscall
slang::BumpAllocator::
emplace<slang::ast::RandSeqProductionSymbol::RepeatProd,slang::ast::Expression_const&,slang::ast::RandSeqProductionSymbol::ProdItem&>
          (BumpAllocator *this,Expression *args,ProdItem *args_1)

{
  ProdItem item;
  RepeatProd *pRVar1;
  undefined8 *in_RDX;
  size_t in_stack_ffffffffffffffa8;
  size_t in_stack_ffffffffffffffb0;
  BumpAllocator *in_stack_ffffffffffffffb8;
  
  pRVar1 = (RepeatProd *)
           allocate(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  item.target = (RandSeqProductionSymbol *)*in_RDX;
  item._0_8_ = pRVar1;
  item.args._M_ptr = (pointer)in_RDX[1];
  item.args._M_extent._M_extent_value = in_RDX[2];
  slang::ast::RandSeqProductionSymbol::RepeatProd::RepeatProd
            ((RepeatProd *)in_RDX[3],(Expression *)in_RDX[2],item);
  return pRVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }